

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBroadphaseProxy.h
# Opt level: O1

bool __thiscall
cbtBroadphasePairSortPredicate::operator()
          (cbtBroadphasePairSortPredicate *this,cbtBroadphasePair *a,cbtBroadphasePair *b)

{
  cbtBroadphaseProxy *pcVar1;
  cbtBroadphaseProxy *pcVar2;
  cbtBroadphaseProxy *pcVar3;
  cbtBroadphaseProxy *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  pcVar1 = a->m_pProxy0;
  iVar7 = -1;
  iVar8 = -1;
  if (pcVar1 != (cbtBroadphaseProxy *)0x0) {
    iVar8 = pcVar1->m_uniqueId;
  }
  pcVar2 = b->m_pProxy0;
  if (pcVar2 != (cbtBroadphaseProxy *)0x0) {
    iVar7 = pcVar2->m_uniqueId;
  }
  pcVar3 = a->m_pProxy1;
  iVar9 = -1;
  iVar6 = -1;
  if (pcVar3 != (cbtBroadphaseProxy *)0x0) {
    iVar6 = pcVar3->m_uniqueId;
  }
  pcVar4 = b->m_pProxy1;
  if (pcVar4 != (cbtBroadphaseProxy *)0x0) {
    iVar9 = pcVar4->m_uniqueId;
  }
  bVar5 = true;
  if (((iVar8 <= iVar7) && (bVar5 = iVar9 < iVar6 && pcVar1 == pcVar2, pcVar1 == pcVar2)) &&
     (iVar6 <= iVar9)) {
    if (pcVar3 == pcVar4) {
      bVar5 = b->m_algorithm < a->m_algorithm;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool operator()(const cbtBroadphasePair& a, const cbtBroadphasePair& b) const
	{
		const int uidA0 = a.m_pProxy0 ? a.m_pProxy0->m_uniqueId : -1;
		const int uidB0 = b.m_pProxy0 ? b.m_pProxy0->m_uniqueId : -1;
		const int uidA1 = a.m_pProxy1 ? a.m_pProxy1->m_uniqueId : -1;
		const int uidB1 = b.m_pProxy1 ? b.m_pProxy1->m_uniqueId : -1;

		return uidA0 > uidB0 ||
			   (a.m_pProxy0 == b.m_pProxy0 && uidA1 > uidB1) ||
			   (a.m_pProxy0 == b.m_pProxy0 && a.m_pProxy1 == b.m_pProxy1 && a.m_algorithm > b.m_algorithm);
	}